

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ClearTest::Compare<float>
          (ClearTest *this,GLfloat *data,GLfloat *reference,GLsizei count)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  
  uVar2 = 0;
  uVar1 = 0;
  if (0 < count) {
    uVar2 = (ulong)(uint)count;
  }
  do {
    uVar3 = uVar1;
    if (uVar2 == uVar3) break;
    fVar4 = data[uVar3] - reference[uVar3];
    fVar5 = -fVar4;
    if (-fVar4 <= fVar4) {
      fVar5 = fVar4;
    }
    uVar1 = uVar3 + 1;
  } while (fVar5 <= 1e-05);
  return (long)count <= (long)uVar3;
}

Assistant:

bool ClearTest::Compare<glw::GLfloat>(const glw::GLfloat* data, const glw::GLfloat* reference, const glw::GLsizei count)
{
	for (glw::GLsizei i = 0; i < count; ++i)
	{
		if (de::abs(data[i] - reference[i]) > 0.00001 /* Precision. */)
		{
			return false;
		}
	}
	return true;
}